

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node::~Node(Node *this)

{
  bool bVar1;
  Term *this_00;
  Node *in_RDI;
  
  in_RDI->_vptr_Node = (_func_int **)&PTR__Node_0130e008;
  this_00 = (Term *)term(in_RDI);
  bVar1 = Kernel::TermList::isTerm((TermList *)0x404af3);
  if (bVar1) {
    term(in_RDI);
    Kernel::TermList::term((TermList *)0x404b1e);
    Kernel::Term::destroyNonShared(this_00);
  }
  return;
}

Assistant:

SubstitutionTree<LeafData_>::Node::~Node()
{
  if(term().isTerm()) {
    term().term()->destroyNonShared();
  }
}